

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

char * __thiscall
fmt::v11::detail::format_handler<char>::on_format_specs
          (format_handler<char> *this,int id,char *begin,char *end)

{
  buffered_context<char> *ctx;
  bool bVar1;
  arg_id_kind aVar2;
  int iVar3;
  char *pcVar4;
  basic_format_arg<fmt::v11::context> arg;
  basic_format_arg<fmt::v11::context> bStack_98;
  dynamic_format_specs<char> local_70;
  arg_formatter<char> local_40;
  
  ctx = &this->ctx;
  get_arg<fmt::v11::context,int>(&bStack_98,(detail *)ctx,(context *)(ulong)(uint)id,(int)end);
  bVar1 = basic_format_arg<fmt::v11::context>::format_custom(&bStack_98,begin,&this->parse_ctx,ctx);
  if (bVar1) {
    pcVar4 = (this->parse_ctx).fmt_.data_;
  }
  else {
    local_70.precision_ref.name.size_ = 0;
    local_70.width_ref.name.data_ = (char *)0x0;
    local_70.width_ref.name.size_ = 0;
    local_70.super_format_specs.super_basic_specs.data_ = 0x8000;
    local_70.super_format_specs.super_basic_specs.fill_data_[0] = ' ';
    local_70.super_format_specs._5_4_ = 0;
    local_70.super_format_specs.width._1_3_ = 0;
    local_70.super_format_specs.precision = -1;
    local_70.precision_ref.name.data_ = (char *)0x0;
    pcVar4 = parse_format_specs<char>(begin,end,&local_70,&this->parse_ctx,bStack_98.type_);
    if ((local_70.super_format_specs.super_basic_specs.data_ & 0x3c0) != 0) {
      aVar2 = local_70.super_format_specs.super_basic_specs.data_ >> 6 & (name|index);
      if (aVar2 != none) {
        iVar3 = get_dynamic_spec<fmt::v11::context>(aVar2,&local_70.width_ref,ctx);
        local_70.super_format_specs.width._0_1_ = (undefined1)iVar3;
        local_70.super_format_specs.width._1_3_ = (undefined3)((uint)iVar3 >> 8);
      }
      aVar2 = local_70.super_format_specs.super_basic_specs.data_ >> 8 & (name|index);
      if (aVar2 != none) {
        local_70.super_format_specs.precision =
             get_dynamic_spec<fmt::v11::context>(aVar2,&local_70.precision_ref,ctx);
      }
    }
    local_40.out.container = (this->ctx).out_.container;
    local_40.locale.locale_ = (this->ctx).loc_.locale_;
    local_40.specs = &local_70.super_format_specs;
    basic_format_arg<fmt::v11::context>::visit<fmt::v11::detail::arg_formatter<char>>
              (&bStack_98,&local_40);
  }
  return pcVar4;
}

Assistant:

auto on_format_specs(int id, const Char* begin, const Char* end)
      -> const Char* {
    auto arg = get_arg(ctx, id);
    // Not using a visitor for custom types gives better codegen.
    if (arg.format_custom(begin, parse_ctx, ctx)) return parse_ctx.begin();

    auto specs = dynamic_format_specs<Char>();
    begin = parse_format_specs(begin, end, specs, parse_ctx, arg.type());
    if (specs.dynamic()) {
      handle_dynamic_spec(specs.dynamic_width(), specs.width, specs.width_ref,
                          ctx);
      handle_dynamic_spec(specs.dynamic_precision(), specs.precision,
                          specs.precision_ref, ctx);
    }

    arg.visit(arg_formatter<Char>{ctx.out(), specs, ctx.locale()});
    return begin;
  }